

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

u64 sqlite3LogEstToInt(LogEst x)

{
  char cVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  short in_register_0000003a;
  
  iVar5 = (CONCAT22(in_register_0000003a,x) / 10 + ((int)in_register_0000003a >> 0x1f)) -
          ((int)in_register_0000003a >> 0x1f);
  uVar2 = CONCAT22(in_register_0000003a,x) + iVar5 * -10;
  lVar3 = 0;
  if (uVar2 != 0) {
    lVar3 = (long)(int)uVar2 + -1;
  }
  if (4 < uVar2) {
    lVar3 = (long)(int)uVar2 + -2;
  }
  cVar1 = (char)iVar5;
  uVar4 = lVar3 + 8U >> (3U - cVar1 & 0x3f);
  if (0x1d < x) {
    uVar4 = lVar3 + 8U << (cVar1 - 3U & 0x3f);
  }
  return uVar4;
}

Assistant:

SQLITE_PRIVATE u64 sqlite3LogEstToInt(LogEst x){
  u64 n;
  n = x%10;
  x /= 10;
  if( n>=5 ) n -= 2;
  else if( n>=1 ) n -= 1;
#if defined(SQLITE_ENABLE_STMT_SCANSTATUS) || \
    defined(SQLITE_EXPLAIN_ESTIMATED_ROWS)
  if( x>60 ) return (u64)LARGEST_INT64;
#else
  /* If only SQLITE_ENABLE_STAT3_OR_STAT4 is on, then the largest input
  ** possible to this routine is 310, resulting in a maximum x of 31 */
  assert( x<=60 );
#endif
  return x>=3 ? (n+8)<<(x-3) : (n+8)>>(3-x);
}